

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

int __thiscall HighsLinearSumBounds::remove(HighsLinearSumBounds *this,char *__filename)

{
  int *piVar1;
  pointer piVar2;
  HighsCDouble *pHVar3;
  int in_EDX;
  int iVar4;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  
  iVar4 = (int)__filename;
  if (this->implVarLowerSource[in_EDX] == iVar4) {
    dVar5 = this->varLower[in_EDX];
  }
  else {
    dVar5 = this->varLower[in_EDX];
    if (this->varLower[in_EDX] <= this->implVarLower[in_EDX]) {
      dVar5 = this->implVarLower[in_EDX];
    }
  }
  if (this->implVarUpperSource[in_EDX] == iVar4) {
    dVar6 = this->varUpper[in_EDX];
  }
  else {
    dVar6 = this->varUpper[in_EDX];
    if (this->implVarUpper[in_EDX] <= this->varUpper[in_EDX]) {
      dVar6 = this->implVarUpper[in_EDX];
    }
  }
  if (in_XMM0_Qa <= 0.0) {
    if (dVar6 < INFINITY) {
      HighsCDouble::operator-=
                ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar4,dVar6 * in_XMM0_Qa);
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      *piVar1 = *piVar1 + -1;
    }
    if (-INFINITY < dVar5) {
      HighsCDouble::operator-=
                ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar4,dVar5 * in_XMM0_Qa);
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      *piVar1 = *piVar1 + -1;
    }
    if (this->varUpper[in_EDX] < INFINITY) {
      HighsCDouble::operator-=
                ((this->sumLowerOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar4,this->varUpper[in_EDX] * in_XMM0_Qa);
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      *piVar1 = *piVar1 + -1;
    }
    dVar5 = this->varLower[in_EDX];
    if (-INFINITY < dVar5) goto LAB_0035dd57;
  }
  else {
    if (-INFINITY < dVar5) {
      HighsCDouble::operator-=
                ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar4,dVar5 * in_XMM0_Qa);
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      *piVar1 = *piVar1 + -1;
    }
    if (dVar6 < INFINITY) {
      HighsCDouble::operator-=
                ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar4,dVar6 * in_XMM0_Qa);
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      *piVar1 = *piVar1 + -1;
    }
    if (-INFINITY < this->varLower[in_EDX]) {
      HighsCDouble::operator-=
                ((this->sumLowerOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar4,this->varLower[in_EDX] * in_XMM0_Qa);
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      *piVar1 = *piVar1 + -1;
    }
    dVar5 = this->varUpper[in_EDX];
    if (dVar5 < INFINITY) {
LAB_0035dd57:
      pHVar3 = HighsCDouble::operator-=
                         ((this->sumUpperOrig).
                          super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                          super__Vector_impl_data._M_start + iVar4,dVar5 * in_XMM0_Qa);
      return (int)pHVar3;
    }
  }
  piVar2 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = piVar2 + iVar4;
  *piVar1 = *piVar1 + -1;
  return (int)piVar2;
}

Assistant:

void HighsLinearSumBounds::remove(HighsInt sum, HighsInt var,
                                  double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varLower[var] * coefficient;
  }
}